

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file_utils.c
# Opt level: O2

char ** apprun_read_lines(FILE *fp)

{
  char *pcVar1;
  uint size;
  int i;
  char **__ptr;
  __ssize_t _Var2;
  char **ppcVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  long lVar7;
  size_t len;
  
  uVar5 = 0x400;
  __ptr = apprun_string_list_alloc(0x400);
  if (fp == (FILE *)0x0) {
    uVar6 = 0;
  }
  else {
    len = 0;
    lVar7 = 1;
    uVar6 = 0;
    while( true ) {
      _Var2 = getline(__ptr + uVar6,&len,(FILE *)fp);
      if (_Var2 == -1) break;
      if ((0 < _Var2) && (pcVar1 = __ptr[uVar6], pcVar1[_Var2 + -1] == '\n')) {
        pcVar1[_Var2 + -1] = '\0';
      }
      uVar6 = uVar6 + 1;
      ppcVar3 = __ptr;
      if (uVar6 == uVar5) {
        size = (int)uVar5 * 2;
        uVar5 = (ulong)size;
        ppcVar3 = apprun_string_list_alloc(size);
        for (lVar4 = 0; lVar7 != lVar4; lVar4 = lVar4 + 1) {
          ppcVar3[lVar4] = __ptr[lVar4];
        }
        free(__ptr);
      }
      lVar7 = lVar7 + 1;
      __ptr = ppcVar3;
    }
  }
  __ptr[uVar6] = (char *)0x0;
  return __ptr;
}

Assistant:

char **apprun_read_lines(FILE *fp) {
    int array_len = 1024;
    int count = 0;
    char **result = apprun_string_list_alloc(array_len);

    if (fp) {
        size_t len = 0;
        ssize_t read;

        while ((read = getline(&result[count], &len, fp)) != -1) {
            if (read > 0 && result[count][read - 1] == '\n')
                result[count][read - 1] = 0;
            count++;
            if (count == array_len) {
                array_len = array_len * 2;
                char **old_array = result;

                result = apprun_string_list_alloc(array_len);
                for (int i = 0; i < count; i++)
                    result[i] = old_array[i];

                free(old_array);
            }
        }
    }

    result[count] = NULL;

    return result;
}